

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# CPU.cpp
# Opt level: O2

void __thiscall CPU::BIT_AB(CPU *this)

{
  byte bVar1;
  uint16_t address;
  
  this->cycles = 4;
  address = GetWord(this);
  bVar1 = ReadByte(this,address);
  (this->field_6).ps = bVar1 & 0xc0 | (this->field_6).ps & 0x3d | ((this->A & bVar1) == 0) * '\x02';
  return;
}

Assistant:

void CPU::BIT_AB()
{
    cycles = 4;
    uint8_t data = ReadByte(GetWord());
    Z = !(A & data);
    V = (data & 0b01000000) > 0;
    N = (data & 0b10000000) > 0;
}